

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::ClipperBase::DeleteFromAEL(ClipperBase *this,TEdge *e)

{
  TEdge *pTVar1;
  TEdge *pTVar2;
  TEdge *AelNext;
  TEdge *AelPrev;
  TEdge *e_local;
  ClipperBase *this_local;
  
  pTVar1 = e->PrevInAEL;
  pTVar2 = e->NextInAEL;
  if (((pTVar1 != (TEdge *)0x0) || (pTVar2 != (TEdge *)0x0)) || (e == this->m_ActiveEdges)) {
    if (pTVar1 == (TEdge *)0x0) {
      this->m_ActiveEdges = pTVar2;
    }
    else {
      pTVar1->NextInAEL = pTVar2;
    }
    if (pTVar2 != (TEdge *)0x0) {
      pTVar2->PrevInAEL = pTVar1;
    }
    e->NextInAEL = (TEdge *)0x0;
    e->PrevInAEL = (TEdge *)0x0;
  }
  return;
}

Assistant:

void ClipperBase::DeleteFromAEL(TEdge *e)
{
  TEdge* AelPrev = e->PrevInAEL;
  TEdge* AelNext = e->NextInAEL;
  if (!AelPrev &&  !AelNext && (e != m_ActiveEdges)) return; //already deleted
  if (AelPrev) AelPrev->NextInAEL = AelNext;
  else m_ActiveEdges = AelNext;
  if (AelNext) AelNext->PrevInAEL = AelPrev;
  e->NextInAEL = 0;
  e->PrevInAEL = 0;
}